

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.cpp
# Opt level: O3

void __thiscall ConfusableMatcher::Free(ConfusableMatcher *this)

{
  char *pcVar1;
  dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
  *pdVar2;
  ConfusableMatcher *pCVar3;
  pointer ppVar4;
  long lVar5;
  int x;
  pointer ppVar6;
  pointer pCVar7;
  vector<CMString,_std::allocator<CMString>_> *pvVar8;
  iterator valMapIt;
  dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
  local_70;
  dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
  local_58;
  ConfusableMatcher *local_40;
  long local_38;
  
  lVar5 = 0;
  local_40 = this;
  do {
    ppVar6 = this->TheMap[lVar5].
             super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38 = lVar5;
    if (ppVar6 != this->TheMap[lVar5].
                  super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        pcVar1 = (ppVar6->first).Str;
        if (pcVar1 != (char *)0x0) {
          operator_delete__(pcVar1);
        }
        local_58.ht = &ppVar6->second->rep;
        local_58.pos = (local_58.ht)->table;
        local_58.end = local_58.pos + (local_58.ht)->num_buckets;
        google::
        dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
        ::advance_past_empty_and_deleted(&local_58);
        while( true ) {
          local_70.ht = &ppVar6->second->rep;
          local_70.pos = (local_70.ht)->table + (local_70.ht)->num_buckets;
          local_70.end = local_70.pos;
          google::
          dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
          ::advance_past_empty_and_deleted(&local_70);
          if (local_58.pos == local_70.pos) break;
          pvVar8 = (local_58.pos)->second;
          pCVar7 = (pvVar8->super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          ppVar4 = local_58.pos;
          if (pCVar7 != (pvVar8->super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                        super__Vector_impl_data._M_finish) {
            do {
              if (pCVar7->Str != (char *)0x0) {
                operator_delete__(pCVar7->Str);
                ppVar4 = local_58.pos;
              }
              pCVar7 = pCVar7 + 1;
              pvVar8 = ppVar4->second;
            } while (pCVar7 != (pvVar8->super__Vector_base<CMString,_std::allocator<CMString>_>).
                               _M_impl.super__Vector_impl_data._M_finish);
            pCVar7 = (pvVar8->super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          }
          if (pCVar7 != (pointer)0x0) {
            operator_delete(pCVar7,(long)(pvVar8->
                                         super__Vector_base<CMString,_std::allocator<CMString>_>).
                                         _M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pCVar7);
          }
          operator_delete(pvVar8,0x18);
          google::
          dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
          ::operator++(&local_58);
        }
        pdVar2 = ppVar6->second;
        if ((pdVar2 != (dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                        *)0x0) && (ppVar4 = (pdVar2->rep).table, ppVar4 != (pointer)0x0)) {
          free(ppVar4);
        }
        operator_delete(pdVar2,0x58);
        ppVar6 = ppVar6 + 1;
      } while (ppVar6 != this->TheMap[lVar5].
                         super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    pCVar3 = local_40;
    lVar5 = local_38 + 1;
  } while (lVar5 != 0x100);
  lVar5 = 0;
  do {
    pvVar8 = pCVar3->SkipSet[lVar5];
    if (pvVar8 != (vector<CMString,_std::allocator<CMString>_> *)0x0) {
      pCVar7 = (pvVar8->super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pCVar7 != (pvVar8->super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                    super__Vector_impl_data._M_finish) {
        do {
          if (pCVar7->Str != (char *)0x0) {
            operator_delete__(pCVar7->Str);
            pvVar8 = pCVar3->SkipSet[lVar5];
          }
          pCVar7 = pCVar7 + 1;
        } while (pCVar7 != (pvVar8->super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl
                           .super__Vector_impl_data._M_finish);
        pCVar7 = (pvVar8->super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      if (pCVar7 != (pointer)0x0) {
        operator_delete(pCVar7,(long)(pvVar8->
                                     super__Vector_base<CMString,_std::allocator<CMString>_>).
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pCVar7);
      }
      operator_delete(pvVar8,0x18);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  return;
}

Assistant:

void ConfusableMatcher::Free()
{
	for (auto x = 0;x < std::extent<decltype(TheMap)>::value;x++) {
		for (auto keyArrayIt = TheMap[x].begin();keyArrayIt != TheMap[x].end();keyArrayIt++) {
			keyArrayIt->first.Free();
			for (auto valMapIt = keyArrayIt->second->begin();valMapIt != keyArrayIt->second->end();valMapIt++) {
				for (auto valArrayIt = valMapIt->second->begin();valArrayIt != valMapIt->second->end();valArrayIt++)
					valArrayIt->Free();

				delete valMapIt->second;
			}
			delete keyArrayIt->second;
		}
	}

	for (auto x = 0;x < std::extent<decltype(SkipSet)>::value;x++) {
		if (SkipSet[x] == nullptr)
			continue;

		for (auto it2 = SkipSet[x]->begin();it2 != SkipSet[x]->end();it2++)
			it2->Free();

		delete SkipSet[x];
	}
}